

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlcdfil.c
# Opt level: O3

FT_Error FT_Library_SetLcdGeometry(FT_Library library,FT_Vector *sub)

{
  FT_Pos FVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  FT_Pos FVar4;
  FT_Pos FVar5;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (sub != (FT_Vector *)0x0) {
    FVar1 = sub->x;
    FVar2 = sub->y;
    FVar3 = sub[1].x;
    FVar4 = sub[1].y;
    FVar5 = sub[2].y;
    library->lcd_geometry[2].x = sub[2].x;
    library->lcd_geometry[2].y = FVar5;
    library->lcd_geometry[1].x = FVar3;
    library->lcd_geometry[1].y = FVar4;
    library->lcd_geometry[0].x = FVar1;
    library->lcd_geometry[0].y = FVar2;
    return 0;
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Library_SetLcdGeometry( FT_Library  library,
                             FT_Vector   sub[3] )
  {
    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !sub )
      return FT_THROW( Invalid_Argument );

    ft_memcpy( library->lcd_geometry, sub, 3 * sizeof( FT_Vector ) );

    return FT_Err_Ok;
  }